

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_test.cc
# Opt level: O1

void __thiscall BLAKE2B256Test_ABC_Test::TestBody(BLAKE2B256Test_ABC_Test *this)

{
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar;
  uint8_t digest [32];
  uint8_t kExpected [32];
  Bytes local_88;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  Bytes local_68;
  AssertHelperData local_58;
  undefined8 uStack_20;
  
  local_58.message.field_2._8_8_ = 0x423ecbb13b4e9694;
  uStack_20 = 0x1923d568c0c86272;
  local_58.message._M_string_length = 0x723942633c81ddbd;
  local_58.message.field_2._M_allocated_capacity = 0x9b5798ee3fef7131;
  BLAKE2B256((uint8_t *)"abc",3,(uint8_t *)&local_58);
  local_88.span_.size_ = 0x20;
  local_68.span_.size_ = 0x20;
  local_88.span_.data_ = (uchar *)&local_58.message._M_string_length;
  local_68.span_.data_ = (uchar *)&local_58;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            (local_78,"Bytes(kExpected)","Bytes(digest)",&local_88,&local_68);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/blake2/blake2_test.cc"
               ,0x21,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if ((size_type *)local_88.span_.data_ != (size_type *)0x0) {
      (**(code **)(*(size_type *)local_88.span_.data_ + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(BLAKE2B256Test, ABC) {
  // https://tools.ietf.org/html/rfc7693#appendix-A, except updated for the
  // 256-bit hash output.
  const uint8_t kExpected[] = {
      0xbd, 0xdd, 0x81, 0x3c, 0x63, 0x42, 0x39, 0x72, 0x31, 0x71, 0xef,
      0x3f, 0xee, 0x98, 0x57, 0x9b, 0x94, 0x96, 0x4e, 0x3b, 0xb1, 0xcb,
      0x3e, 0x42, 0x72, 0x62, 0xc8, 0xc0, 0x68, 0xd5, 0x23, 0x19,
  };

  uint8_t digest[BLAKE2B256_DIGEST_LENGTH];
  BLAKE2B256((const uint8_t *)"abc", 3, digest);
  EXPECT_EQ(Bytes(kExpected), Bytes(digest));
}